

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

void LoadFunction(LoadState *S,Proto *fp,TString *psource)

{
  SharedProto *pSVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  TString *pTVar5;
  Instruction *b;
  TValue *pTVar6;
  Upvaldesc *pUVar7;
  Proto **ppPVar8;
  Proto *pPVar9;
  int *b_00;
  LocVar *pLVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  int iVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar19;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined1 auVar22 [16];
  int x;
  uint local_40;
  undefined4 uStack_3c;
  size_t local_38;
  
  pSVar1 = fp->sp;
  pTVar5 = LoadString(S);
  if (pTVar5 != (TString *)0x0) {
    psource = pTVar5;
  }
  pSVar1->source = psource;
  LoadBlock(S,&local_40,4);
  pSVar1->linedefined = local_40;
  LoadBlock(S,&local_40,4);
  pSVar1->lastlinedefined = local_40;
  LoadBlock(S,&local_40,1);
  pSVar1->numparams = (lu_byte)local_40;
  LoadBlock(S,&local_40,1);
  pSVar1->is_vararg = (lu_byte)local_40;
  LoadBlock(S,&local_40,1);
  pSVar1->maxstacksize = (lu_byte)local_40;
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar12 = (long)(int)local_40;
  b = (Instruction *)luaM_realloc_(S->L,(void *)0x0,0,lVar12 << 2);
  pSVar1->code = b;
  pSVar1->sizecode = uVar4;
  LoadBlock(S,b,lVar12 << 2);
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar12 = (long)(int)local_40;
  local_38 = lVar12 << 4;
  pTVar6 = (TValue *)luaM_realloc_(S->L,(void *)0x0,0,local_38);
  fp->k = pTVar6;
  fp->sp->sizek = uVar4;
  auVar3 = _DAT_001495e0;
  if (0 < lVar12) {
    lVar12 = lVar12 + -1;
    auVar14._8_4_ = (int)lVar12;
    auVar14._0_8_ = lVar12;
    auVar14._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar14 = auVar14 ^ _DAT_001495e0;
    auVar21 = _DAT_001495c0;
    auVar20 = _DAT_001495d0;
    do {
      auVar22 = auVar20 ^ auVar3;
      iVar17 = auVar14._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar17 && auVar14._0_4_ < auVar22._0_4_ ||
                  iVar17 < auVar22._4_4_) & 1)) {
        *(undefined4 *)((long)&pTVar6->tt_ + lVar12) = 0;
      }
      if ((auVar22._12_4_ != auVar14._12_4_ || auVar22._8_4_ <= auVar14._8_4_) &&
          auVar22._12_4_ <= auVar14._12_4_) {
        *(undefined4 *)((long)&pTVar6[1].tt_ + lVar12) = 0;
      }
      auVar22 = auVar21 ^ auVar3;
      iVar23 = auVar22._4_4_;
      if (iVar23 <= iVar17 && (iVar23 != iVar17 || auVar22._0_4_ <= auVar14._0_4_)) {
        *(undefined4 *)((long)&pTVar6[2].tt_ + lVar12) = 0;
        *(undefined4 *)((long)&pTVar6[3].tt_ + lVar12) = 0;
      }
      lVar13 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar13 + 4;
      lVar13 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar13 + 4;
      lVar12 = lVar12 + 0x40;
    } while ((ulong)(uVar4 + 3 >> 2) << 6 != lVar12);
    sVar11 = 0;
    do {
      pTVar6 = fp->k;
      LoadBlock(S,&local_40,1);
      uVar4 = local_40 & 0xff;
      switch((lu_byte)local_40) {
      case '\0':
        break;
      case '\x01':
        LoadBlock(S,&local_40,1);
        *(uint *)((long)&pTVar6->value_ + sVar11) = local_40 & 0xff;
        uVar4 = 1;
        break;
      case '\x02':
        goto switchD_00146704_caseD_2;
      case '\x03':
        LoadBlock(S,&local_40,8);
        *(ulong *)((long)&pTVar6->value_ + sVar11) = CONCAT44(uStack_3c,local_40);
        uVar4 = 3;
        break;
      case '\x04':
switchD_00146704_caseD_4:
        pTVar5 = LoadString(S);
        *(TString **)((long)&pTVar6->value_ + sVar11) = pTVar5;
        uVar4 = pTVar5->tt | 0x40;
        break;
      default:
        if ((local_40 & 0xff) == 0x13) {
          LoadBlock(S,&local_40,8);
          *(ulong *)((long)&pTVar6->value_ + sVar11) = CONCAT44(uStack_3c,local_40);
          uVar4 = 0x13;
          break;
        }
        if ((local_40 & 0xff) == 0x14) goto switchD_00146704_caseD_4;
        goto switchD_00146704_caseD_2;
      }
      *(uint *)((long)&pTVar6->tt_ + sVar11) = uVar4;
switchD_00146704_caseD_2:
      sVar11 = sVar11 + 0x10;
    } while (local_38 != sVar11);
  }
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar12 = (long)(int)local_40;
  pUVar7 = (Upvaldesc *)luaM_realloc_(S->L,(void *)0x0,0,lVar12 << 4);
  pSVar1->upvalues = pUVar7;
  pSVar1->sizeupvalues = uVar4;
  auVar3 = _DAT_001495e0;
  if (0 < lVar12) {
    lVar13 = lVar12 + -1;
    auVar15._8_4_ = (int)lVar13;
    auVar15._0_8_ = lVar13;
    auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar15 = auVar15 ^ _DAT_001495e0;
    auVar22 = _DAT_001495d0;
    do {
      bVar2 = auVar15._0_4_ < SUB164(auVar22 ^ auVar3,0);
      iVar17 = auVar15._4_4_;
      iVar23 = SUB164(auVar22 ^ auVar3,4);
      if ((bool)(~(iVar17 < iVar23 || iVar23 == iVar17 && bVar2) & 1)) {
        *(undefined8 *)((long)&pUVar7->name + lVar13) = 0;
      }
      if (iVar17 >= iVar23 && (iVar23 != iVar17 || !bVar2)) {
        *(undefined8 *)((long)&pUVar7[1].name + lVar13) = 0;
      }
      lVar19 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 2;
      auVar22._8_8_ = lVar19 + 2;
      lVar13 = lVar13 + 0x20;
    } while ((ulong)(uVar4 + 1 >> 1) << 5 != lVar13);
    sVar11 = 0;
    do {
      LoadBlock(S,&local_40,1);
      (&pSVar1->upvalues->instack)[sVar11] = (lu_byte)local_40;
      LoadBlock(S,&local_40,1);
      (&pSVar1->upvalues->idx)[sVar11] = (lu_byte)local_40;
      sVar11 = sVar11 + 0x10;
    } while (lVar12 << 4 != sVar11);
  }
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar12 = (long)(int)local_40;
  ppPVar8 = (Proto **)luaM_realloc_(S->L,(void *)0x0,0,lVar12 * 8);
  fp->p = ppPVar8;
  fp->sp->sizep = uVar4;
  if (0 < lVar12) {
    lVar13 = 0;
    do {
      fp->p[lVar13] = (Proto *)0x0;
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
    if (0 < (int)uVar4) {
      lVar13 = 0;
      do {
        pPVar9 = luaF_newproto(S->L,(SharedProto *)0x0);
        fp->p[lVar13] = pPVar9;
        LoadFunction(S,fp->p[lVar13],fp->sp->source);
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
    }
  }
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar12 = (long)(int)local_40;
  b_00 = (int *)luaM_realloc_(S->L,(void *)0x0,0,lVar12 << 2);
  pSVar1->lineinfo = b_00;
  pSVar1->sizelineinfo = uVar4;
  LoadBlock(S,b_00,lVar12 << 2);
  LoadBlock(S,&local_40,4);
  uVar4 = local_40;
  lVar12 = (long)(int)local_40;
  pLVar10 = (LocVar *)luaM_realloc_(S->L,(void *)0x0,0,lVar12 << 4);
  pSVar1->locvars = pLVar10;
  pSVar1->sizelocvars = uVar4;
  auVar3 = _DAT_001495e0;
  if (0 < lVar12) {
    lVar13 = lVar12 + -1;
    auVar16._8_4_ = (int)lVar13;
    auVar16._0_8_ = lVar13;
    auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar16 = auVar16 ^ _DAT_001495e0;
    auVar18 = _DAT_001495d0;
    do {
      auVar21 = auVar18 ^ auVar3;
      if ((bool)(~(auVar21._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar21._0_4_ ||
                  auVar16._4_4_ < auVar21._4_4_) & 1)) {
        *(undefined8 *)((long)&pLVar10->varname + lVar13) = 0;
      }
      if ((auVar21._12_4_ != auVar16._12_4_ || auVar21._8_4_ <= auVar16._8_4_) &&
          auVar21._12_4_ <= auVar16._12_4_) {
        *(undefined8 *)((long)&pLVar10[1].varname + lVar13) = 0;
      }
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 2;
      auVar18._8_8_ = lVar19 + 2;
      lVar13 = lVar13 + 0x20;
    } while ((ulong)(uVar4 + 1 >> 1) << 5 != lVar13);
    sVar11 = 0;
    do {
      pTVar5 = LoadString(S);
      *(TString **)((long)&pSVar1->locvars->varname + sVar11) = pTVar5;
      LoadBlock(S,&local_40,4);
      *(uint *)((long)&pSVar1->locvars->startpc + sVar11) = local_40;
      LoadBlock(S,&local_40,4);
      *(uint *)((long)&pSVar1->locvars->endpc + sVar11) = local_40;
      sVar11 = sVar11 + 0x10;
    } while (lVar12 << 4 != sVar11);
  }
  LoadBlock(S,&local_40,4);
  if (0 < (long)(int)local_40) {
    lVar12 = 0;
    do {
      pTVar5 = LoadString(S);
      *(TString **)((long)&pSVar1->upvalues->name + lVar12) = pTVar5;
      lVar12 = lVar12 + 0x10;
    } while ((long)(int)local_40 * 0x10 != lVar12);
  }
  return;
}

Assistant:

static void LoadFunction (LoadState *S, Proto *fp, TString *psource) {
  SharedProto *f = fp->sp;
  f->source = LoadString(S);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = LoadInt(S);
  f->lastlinedefined = LoadInt(S);
  f->numparams = LoadByte(S);
  f->is_vararg = LoadByte(S);
  f->maxstacksize = LoadByte(S);
  LoadCode(S, f);
  LoadConstants(S, fp);
  LoadUpvalues(S, f);
  LoadProtos(S, fp);
  LoadDebug(S, f);
}